

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

CURLcode do_init_reader_stack(Curl_easy *data,Curl_creader *r)

{
  curl_off_t cVar1;
  curl_off_t clen;
  CURLcode result;
  Curl_creader *r_local;
  Curl_easy *data_local;
  
  clen._4_4_ = CURLE_OK;
  (data->req).reader_stack = r;
  cVar1 = (*r->crt->total_length)(data,r);
  if ((cVar1 == 0) ||
     ((((*(ulong *)&(data->set).field_0x89c >> 8 & 1) == 0 &&
       ((*(uint *)&(data->state).field_0x7be >> 0xe & 1) == 0)) ||
      (clen._4_4_ = cr_lc_add(data), data_local._4_4_ = clen._4_4_, clen._4_4_ == CURLE_OK)))) {
    data_local._4_4_ = clen._4_4_;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode do_init_reader_stack(struct Curl_easy *data,
                                     struct Curl_creader *r)
{
  CURLcode result = CURLE_OK;
  curl_off_t clen;

  DEBUGASSERT(r);
  DEBUGASSERT(r->crt);
  DEBUGASSERT(r->phase == CURL_CR_CLIENT);
  DEBUGASSERT(!data->req.reader_stack);

  data->req.reader_stack = r;
  clen = r->crt->total_length(data, r);
  /* if we do not have 0 length init, and crlf conversion is wanted,
   * add the reader for it */
  if(clen && (data->set.crlf
#ifdef CURL_PREFER_LF_LINEENDS
     || data->state.prefer_ascii
#endif
    )) {
    result = cr_lc_add(data);
    if(result)
      return result;
  }

  return result;
}